

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

char * __thiscall leveldb::Arena::AllocateFallback(Arena *this,size_t bytes)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bytes < 0x401) {
    pcVar2 = AllocateNewBlock(this,0x1000);
    this->alloc_ptr_ = pcVar2 + bytes;
    this->alloc_bytes_remaining_ = 0x1000 - bytes;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return pcVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pcVar2 = AllocateNewBlock(this,bytes);
    return pcVar2;
  }
  __stack_chk_fail();
}

Assistant:

char* Arena::AllocateFallback(size_t bytes) {
  if (bytes > kBlockSize / 4) {
    // Object is more than a quarter of our block size.  Allocate it separately
    // to avoid wasting too much space in leftover bytes.
    char* result = AllocateNewBlock(bytes);
    return result;
  }

  // We waste the remaining space in the current block.
  alloc_ptr_ = AllocateNewBlock(kBlockSize);
  alloc_bytes_remaining_ = kBlockSize;

  char* result = alloc_ptr_;
  alloc_ptr_ += bytes;
  alloc_bytes_remaining_ -= bytes;
  return result;
}